

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

bool __thiscall
jsoncons::typed_array_visitor<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
visit_double(typed_array_visitor<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *this,
            double value,semantic_tag param_3,ser_context *param_4,error_code *param_5)

{
  double in_XMM0_Qa;
  value_type_conflict3 *in_stack_ffffffffffffffc8;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             ((long)in_XMM0_Qa |
             (long)(in_XMM0_Qa - 9.223372036854776e+18) & (long)in_XMM0_Qa >> 0x3f),
             in_stack_ffffffffffffffc8);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double value, 
            semantic_tag,
            const ser_context&,
            std::error_code&) override
        {
            v_.push_back(static_cast<value_type>(value));
            JSONCONS_VISITOR_RETURN;
        }